

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void save_cursor(Terminal *term,_Bool save)

{
  _Bool _Var1;
  wchar_t wVar2;
  optionalrgb oVar3;
  pos pVar4;
  unsigned_long uVar5;
  truecolour tVar6;
  undefined4 uVar7;
  wchar_t wVar8;
  undefined7 in_register_00000031;
  char cVar9;
  
  if ((int)CONCAT71(in_register_00000031,save) != 0) {
    term->savecurs = term->curs;
    term->save_attr = term->curr_attr;
    term->save_truecolour = term->curr_truecolour;
    term->save_cset = term->cset;
    term->save_utf = term->utf;
    term->save_wnext = term->wrapnext;
    term->save_csattr = term->cset_attr[term->cset];
    term->save_sco_acs = term->sco_acs;
    return;
  }
  pVar4 = term->savecurs;
  term->curs = pVar4;
  wVar2 = term->cols;
  wVar8 = pVar4.x;
  if (wVar2 <= wVar8) {
    wVar8 = wVar2 + L'\xffffffff';
    (term->curs).x = wVar8;
  }
  if (term->rows <= pVar4.y) {
    (term->curs).y = term->rows + L'\xffffffff';
  }
  term->curr_attr = term->save_attr;
  term->curr_truecolour = term->save_truecolour;
  term->cset = term->save_cset;
  term->utf = term->save_utf;
  _Var1 = term->save_wnext;
  cVar9 = '\0';
  if (wVar2 + L'\xffffffff' <= wVar8) {
    cVar9 = _Var1;
  }
  if (_Var1 == false) {
    cVar9 = _Var1;
  }
  term->wrapnext = (_Bool)cVar9;
  term->cset_attr[term->save_cset] = term->save_csattr;
  term->sco_acs = term->save_sco_acs;
  uVar5 = (term->basic_erase_char).attr;
  tVar6 = (term->basic_erase_char).truecolour;
  wVar8 = (term->basic_erase_char).cc_next;
  uVar7 = *(undefined4 *)&(term->basic_erase_char).field_0x1c;
  (term->erase_char).chr = (term->basic_erase_char).chr;
  (term->erase_char).attr = uVar5;
  (term->erase_char).truecolour = tVar6;
  (term->erase_char).cc_next = wVar8;
  *(undefined4 *)&(term->erase_char).field_0x1c = uVar7;
  if (term->use_bce == true) {
    oVar3 = (term->curr_truecolour).bg;
    (term->erase_char).attr = (ulong)(uint)(term->curr_attr & 0x3ffff);
    (term->erase_char).truecolour.bg = oVar3;
  }
  return;
}

Assistant:

static void save_cursor(Terminal *term, bool save)
{
    if (save) {
        term->savecurs = term->curs;
        term->save_attr = term->curr_attr;
        term->save_truecolour = term->curr_truecolour;
        term->save_cset = term->cset;
        term->save_utf = term->utf;
        term->save_wnext = term->wrapnext;
        term->save_csattr = term->cset_attr[term->cset];
        term->save_sco_acs = term->sco_acs;
    } else {
        term->curs = term->savecurs;
        /* Make sure the window hasn't shrunk since the save */
        if (term->curs.x >= term->cols)
            term->curs.x = term->cols - 1;
        if (term->curs.y >= term->rows)
            term->curs.y = term->rows - 1;

        term->curr_attr = term->save_attr;
        term->curr_truecolour = term->save_truecolour;
        term->cset = term->save_cset;
        term->utf = term->save_utf;
        term->wrapnext = term->save_wnext;
        /*
         * wrapnext might reset to False if the x position is no
         * longer at the rightmost edge.
         */
        if (term->wrapnext && term->curs.x < term->cols-1)
            term->wrapnext = false;
        term->cset_attr[term->cset] = term->save_csattr;
        term->sco_acs = term->save_sco_acs;
        set_erase_char(term);
    }
}